

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void setup_call_hard_reg_args(gen_ctx_t gen_ctx,MIR_insn_t call_insn,MIR_reg_t hard_reg)

{
  void *pvVar1;
  MIR_context_t ctx;
  MIR_op_mode_t MVar2;
  MIR_op_mode_t MVar3;
  MIR_reg_t MVar4;
  uint var;
  undefined8 *puVar5;
  void *pvVar6;
  size_t sVar7;
  MIR_type_t type;
  MIR_insn_t_conflict insn;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t bm;
  int iStack_74;
  undefined1 auStack_70 [16];
  anon_union_32_12_57d33f68_for_u aStack_60;
  ulong uStack_40;
  
  if ((0x21 < hard_reg) || (2 < *(int *)&call_insn->field_0x18 - 0xa7U)) {
    __assert_fail("MIR_call_code_p (call_insn->code) && hard_reg <= ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2d0,"void setup_call_hard_reg_args(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
  }
  pvVar1 = call_insn->data;
  if (gen_ctx->optimize_level != 0) {
    bm = *(gen_ctx_t *)((long)pvVar1 + 0x48);
    bitmap_expand((bitmap_t)bm,(ulong)hard_reg + 1);
    if (bm != (gen_ctx_t)0x0) goto LAB_0016bd88;
    setup_call_hard_reg_args_cold_1();
  }
  if (*(long *)((long)pvVar1 + 8) == 0) {
    puVar5 = (undefined8 *)malloc(0x18);
    *puVar5 = 0;
    puVar5[1] = 1;
    pvVar6 = malloc(8);
    puVar5[2] = pvVar6;
    *(undefined8 **)((long)pvVar1 + 8) = puVar5;
  }
  bm = *(gen_ctx_t *)((long)pvVar1 + 8);
  insn = (MIR_insn_t_conflict)((ulong)hard_reg + 1);
  gen_ctx_00 = bm;
  bitmap_expand((bitmap_t)bm,(size_t)insn);
  if (bm == (gen_ctx_t)0x0) {
    setup_call_hard_reg_args_cold_2();
    ctx = gen_ctx_00->ctx;
    uStack_40 = (ulong)hard_reg;
    sVar7 = MIR_insn_nops(ctx,insn);
    if (((1 < sVar7) && (*(int *)&insn->field_0x18 != 0xab)) &&
       (2 < *(int *)&insn->field_0x18 - 0xa7U)) {
      MIR_insn_op_mode(ctx,insn,1,&iStack_74);
      if (iStack_74 != 0) {
        __assert_fail("!out_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1b95,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
      }
      MVar2 = MIR_insn_op_mode(ctx,insn,0,&iStack_74);
      if (iStack_74 != 0) {
        MVar3 = MIR_insn_op_mode(ctx,insn,1,&iStack_74);
        if ((MVar2 == MVar3) && (iStack_74 == 0)) {
          if (MVar2 == MIR_OP_FLOAT) {
            type = MIR_T_F;
          }
          else if (MVar2 == MIR_OP_DOUBLE) {
            type = MIR_T_D;
          }
          else {
            type = (uint)(MVar2 == MIR_OP_LDOUBLE) * 4 + MIR_T_I64;
          }
          MVar4 = _MIR_new_temp_reg(gen_ctx_00->ctx,type,(gen_ctx_00->curr_func_item->u).func);
          var = MVar4 + 0x21;
          if ((var != 0xffffffff) && (gen_ctx_00->curr_cfg->max_var < var)) {
            gen_ctx_00->curr_cfg->max_var = var;
          }
          _MIR_new_var_op(ctx,var);
          add_reload(gen_ctx_00,insn,(MIR_op_t *)(insn + 1),(MIR_op_t *)auStack_70,type,0);
          add_reload(gen_ctx_00,insn,insn->ops,(MIR_op_t *)auStack_70,type,1);
          insn[1].insn_link.next = (MIR_insn_t)aStack_60.i;
          *(char **)&insn[1].field_0x18 = aStack_60.str.s;
          insn[1].ops[0].data = (void *)aStack_60._16_8_;
          *(MIR_disp_t *)&insn[1].ops[0].field_0x8 = aStack_60.mem.disp;
          insn[1].data = (void *)auStack_70._0_8_;
          insn[1].insn_link.prev = (MIR_insn_t)auStack_70._8_8_;
          insn[1].insn_link.next = (MIR_insn_t)aStack_60.i;
          *(char **)&insn[1].field_0x18 = aStack_60.str.s;
          insn->ops[0].data = (void *)auStack_70._0_8_;
          *(undefined8 *)&insn->ops[0].field_0x8 = auStack_70._8_8_;
          insn->ops[0].u.i = aStack_60.i;
          insn->ops[0].u.str.s = aStack_60.str.s;
          insn->ops[0].u.i = aStack_60.i;
          insn->ops[0].u.str.s = aStack_60.str.s;
          *(undefined8 *)((long)&insn->ops[0].u + 0x10) = aStack_60._16_8_;
          insn->ops[0].u.mem.disp = aStack_60.mem.disp;
          return;
        }
      }
      __assert_fail("out_p && mode == MIR_insn_op_mode (ctx, insn, 1, &out_p) && !out_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1b97,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
    }
    __assert_fail("MIR_insn_nops (ctx, insn) >= 2 && !MIR_call_code_p (insn->code) && insn->code != MIR_RET"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1b93,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
  }
LAB_0016bd88:
  bm->curr_func_item->data =
       (void *)((ulong)bm->curr_func_item->data | 1L << ((ulong)hard_reg & 0x3f));
  return;
}

Assistant:

static void MIR_UNUSED setup_call_hard_reg_args (gen_ctx_t gen_ctx, MIR_insn_t call_insn,
                                                 MIR_reg_t hard_reg) {
  insn_data_t insn_data;

  gen_assert (MIR_call_code_p (call_insn->code) && hard_reg <= MAX_HARD_REG);
  if (optimize_level != 0) {
    bitmap_set_bit_p (((bb_insn_t) call_insn->data)->call_hard_reg_args, hard_reg);
    return;
  }
  if ((insn_data = call_insn->data)->u.call_hard_reg_args == NULL)
    insn_data->u.call_hard_reg_args = (void *) bitmap_create2 (MAX_HARD_REG + 1);
  bitmap_set_bit_p (insn_data->u.call_hard_reg_args, hard_reg);
}